

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.cpp
# Opt level: O0

address __thiscall
pstore::transaction_base::allocate(transaction_base *this,uint64_t size,uint align)

{
  bool bVar1;
  uint64_t uVar2;
  uint64_t bytes_allocated;
  uint64_t local_38;
  uint64_t old_size;
  database *db;
  uint64_t uStack_20;
  uint align_local;
  uint64_t size_local;
  transaction_base *this_local;
  address result;
  
  db._4_4_ = align;
  uStack_20 = size;
  size_local = (uint64_t)this;
  old_size = (uint64_t)transaction_base::db(this);
  local_38 = database::size((database *)old_size);
  this_local = (transaction_base *)
               (**(code **)(*(long *)old_size + 0x20))(old_size,uStack_20,db._4_4_);
  bytes_allocated = (uint64_t)address::null();
  bVar1 = pstore::operator==(&this->first_,(address *)&bytes_allocated);
  if (bVar1) {
    if (this->size_ != 0) {
      raise<pstore::error_code>(cannot_allocate_after_commit);
    }
    (this->first_).a_ = (value_type)this_local;
  }
  uVar2 = database::size((database *)old_size);
  if (uVar2 - local_38 < uStack_20) {
    assert_failed("bytes_allocated >= size",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/transaction.cpp"
                  ,0x44);
  }
  this->size_ = (uVar2 - local_38) + this->size_;
  return (address)(value_type)this_local;
}

Assistant:

address transaction_base::allocate (std::uint64_t const size, unsigned const align) {
        database & db = this->db ();
        auto const old_size = db.size ();
        address const result = db.allocate (size, align);
        if (first_ == address::null ()) {
            if (size_ != 0) {
                // Cannot allocate data after a transaction has been committed
                raise (error_code::cannot_allocate_after_commit);
            }
            first_ = result;
        }

        // Increase the transaction size by the actual number of bytes
        // allocated. This may be greater than the number requested to
        // allow for alignment.
        auto const bytes_allocated = db.size () - old_size;
        PSTORE_ASSERT (bytes_allocated >= size);
        size_ += bytes_allocated;
        return result;
    }